

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsEndpointSendStringTo(HelicsEndpoint endpoint,char *message,char *dest,HelicsError *err)

{
  Endpoint *this;
  undefined8 *puVar1;
  size_t data_size;
  size_t sVar2;
  _Alloc_hider _Var3;
  _Alloc_hider data;
  bool bVar4;
  string_view dest_00;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (endpoint == (HelicsEndpoint)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001adef1;
    }
    else {
      bVar4 = *(int *)((long)endpoint + 0x20) == -0x4bac6b3e;
      puVar1 = (undefined8 *)0x0;
      if (bVar4) {
        puVar1 = (undefined8 *)endpoint;
      }
      if (bVar4 || err == (HelicsError *)0x0) goto LAB_001adef3;
    }
    err->error_code = -3;
    err->message = "The given endpoint does not point to a valid object";
  }
LAB_001adef1:
  puVar1 = (undefined8 *)0x0;
LAB_001adef3:
  if (puVar1 != (undefined8 *)0x0) {
    this = (Endpoint *)*puVar1;
    data_size = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    data._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (message != (char *)0x0) {
      data_size = strlen(message);
      data._M_p = message;
    }
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var3._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (dest != (char *)0x0) {
      sVar2 = strlen(dest);
      _Var3._M_p = dest;
    }
    dest_00._M_str = _Var3._M_p;
    dest_00._M_len = sVar2;
    helics::Endpoint::sendTo(this,data._M_p,data_size,dest_00);
  }
  return;
}

Assistant:

void helicsEndpointSendStringTo(HelicsEndpoint endpoint, const char* message, const char* dest, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->sendTo(AS_STRING_VIEW(message), AS_STRING_VIEW(dest));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}